

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

DatabaseSnapshot * __thiscall
Database::snapshot(DatabaseSnapshot *__return_storage_ptr__,Database *this)

{
  pointer ppOVar1;
  __node_base *p_Var2;
  pointer ppOVar3;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> cds;
  unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
  taskspecs;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_198;
  _Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> local_188;
  _Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> local_168;
  undefined1 local_150 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  local_118;
  path local_e8;
  path local_a8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_188._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppOVar1 = (this->working_datasets).
            super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppOVar3 = (this->working_datasets).
                 super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppOVar3 != ppOVar1; ppOVar3 = ppOVar3 + 1) {
    local_150._0_8_ = *ppOVar3;
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::push_back
              ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)&local_188,
               (value_type *)local_150);
  }
  local_150._0_8_ = local_150 + 0x30;
  local_150._8_8_ = 1;
  local_150._16_8_ = (_Hash_node_base *)0x0;
  local_150._24_8_ = 0;
  local_150._32_4_ = 1.0;
  local_150._40_8_ = 0;
  local_150._48_8_ = (__node_base_ptr)0x0;
  p_Var2 = &(this->tasks)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,TaskSpec>,std::allocator<std::pair<unsigned_long_const,TaskSpec>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_long_const&,TaskSpec&>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,TaskSpec>,std::allocator<std::pair<unsigned_long_const,TaskSpec>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_150,p_Var2 + 1,
               *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor);
  }
  std::experimental::filesystem::v1::__cxx11::path::path(&local_a8,&this->db_name);
  std::experimental::filesystem::v1::__cxx11::path::path(&local_e8,&this->db_base);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_198,&(this->config_).config_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  ::_Rb_tree(&local_118,&(this->iterators)._M_t);
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::vector
            ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)&local_168,
             (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)&local_188);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_68,
               (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)local_150);
  DatabaseSnapshot::DatabaseSnapshot
            (__return_storage_ptr__,&local_a8,&local_e8,(DatabaseConfig *)&local_198,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
              *)&local_118,
             (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)&local_168,
             (unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
              *)&local_68);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~_Vector_base
            (&local_168);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  ::~_Rb_tree(&local_118);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_198);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_e8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_a8);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_150);
  std::_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~_Vector_base
            (&local_188);
  return __return_storage_ptr__;
}

Assistant:

DatabaseSnapshot Database::snapshot() {
    std::vector<const OnDiskDataset *> cds;
    for (const auto *d : working_datasets) {
        cds.push_back(d);
    }

    std::unordered_map<uint64_t, TaskSpec> taskspecs;
    for (const auto &[k, v] : tasks) {
        taskspecs.emplace(k, *v.get());
    }

    return DatabaseSnapshot(db_name, db_base, config_, iterators, cds,
                            taskspecs);
}